

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O0

bool __thiscall
sjtu::UserManager::refund_order
          (UserManager *this,OrderManager *order_manager,int n,orderType *order)

{
  long lVar1;
  string *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  pair<long,_bool> pVar2;
  pair<sjtu::orderType,_long> *now;
  pair<sjtu::orderType,_long> *ret;
  locType tmpticket;
  userType *cur;
  pair<long,_bool> tmp;
  allocator *this_00;
  undefined8 local_98;
  long local_90;
  long local_88;
  undefined1 local_80;
  unsigned_long_long *in_stack_ffffffffffffff98;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_ffffffffffffffa0;
  long local_38;
  undefined1 local_30;
  string *local_28;
  int local_1c;
  long local_18;
  bool local_1;
  
  this_00 = (allocator *)&stack0xffffffffffffff9f;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,(char *)in_RCX,this_00);
  StringHasher::operator()((StringHasher *)this_00,in_RCX);
  pVar2 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_88 = pVar2.first;
  local_80 = pVar2.second;
  local_38 = local_88;
  local_30 = local_80;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  local_90 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),&local_38);
  if (*(int *)(local_90 + 0x80) < local_1c) {
    local_1 = false;
  }
  else {
    local_98 = *(undefined8 *)(local_90 + 0x70);
    while (local_1c = local_1c + -1, local_1c != 0) {
      lVar1 = (**(code **)(**(long **)(local_18 + 0x10) + 0x10))
                        (*(long **)(local_18 + 0x10),&local_98);
      local_98 = *(undefined8 *)(lVar1 + 0xb8);
    }
    lVar1 = (**(code **)(**(long **)(local_18 + 0x10) + 0x10))
                      (*(long **)(local_18 + 0x10),&local_98);
    if (*(int *)(lVar1 + 0xa8) == 2) {
      local_1 = false;
    }
    else {
      *(undefined4 *)(local_28 + 0xa8) = *(undefined4 *)(lVar1 + 0xa8);
      *(undefined4 *)(lVar1 + 0xa8) = 2;
      *(undefined8 *)(local_28 + 0x2c) = *(undefined8 *)(lVar1 + 0x2c);
      *(undefined8 *)(local_28 + 0x34) = *(undefined8 *)(lVar1 + 0x34);
      *(undefined8 *)(local_28 + 0x3c) = *(undefined8 *)(lVar1 + 0x3c);
      *(undefined8 *)(local_28 + 0x44) = *(undefined8 *)(lVar1 + 0x44);
      *(undefined4 *)(local_28 + 0xa0) = *(undefined4 *)(lVar1 + 0xa0);
      *(undefined4 *)(local_28 + 0xa4) = *(undefined4 *)(lVar1 + 0xa4);
      *(undefined8 *)(local_28 + 0xb0) = *(undefined8 *)(lVar1 + 0xb0);
      strcpy((char *)(local_28 + 0x15),(char *)(lVar1 + 0x15));
      strcpy((char *)(local_28 + 0x4c),(char *)(lVar1 + 0x4c));
      strcpy((char *)(local_28 + 0x75),(char *)(lVar1 + 0x75));
      (**(code **)(**(long **)(local_18 + 0x10) + 0x18))(*(long **)(local_18 + 0x10),lVar1 + 0xb0);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool UserManager::refund_order(OrderManager *order_manager, int n, orderType *order) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(order->username));
            userType *cur = UserFile->read(tmp.first);
            if (cur->order_count < n) return false;
            else {
                locType tmpticket = cur->head;
                while(-- n) {
                    auto ret = order_manager->OrderFile->read(tmpticket);   //std::pair<*orderType , locType>
                    tmpticket = ret -> second;
                }
                auto now = order_manager->OrderFile->read(tmpticket);
                if (now -> first.status == refunded) return false;
                order -> status = now -> first.status , now -> first.status = refunded;
                order -> date[0] = now -> first.date[0] , order -> date[1] = now -> first.date[1];
                order -> num = now -> first.num , order -> price = now -> first.price , order -> offset = now -> first.offset;
                strcpy(order -> trainID , now -> first.trainID);
                strcpy(order -> station[0] , now -> first.station[0]) , strcpy(order -> station[1] , now -> first.station[1]);
                order_manager->OrderFile->save(now -> first.offset);
                return true;
            }
        }